

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void warning(c2m_ctx_t c2m_ctx,pos_t pos,char *format,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  FILE *local_50;
  FILE *f;
  va_list args;
  char *format_local;
  c2m_ctx_t c2m_ctx_local;
  pos_t pos_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_50 = (FILE *)c2m_ctx->options->message_file;
  if ((local_50 != (FILE *)0x0) &&
     (c2m_ctx->n_warnings = c2m_ctx->n_warnings + 1, c2m_ctx->options->ignore_warnings_p == 0)) {
    args[0].overflow_arg_area = local_108;
    args[0]._0_8_ = &stack0x00000008;
    f._4_4_ = 0x30;
    f._0_4_ = 0x20;
    local_e8 = in_R8;
    local_e0 = in_R9;
    print_pos((FILE *)local_50,pos,1);
    fprintf(local_50,"warning -- ");
    vfprintf(local_50,format,&f);
    fprintf(local_50,"\n");
  }
  return;
}

Assistant:

static void warning (c2m_ctx_t c2m_ctx, pos_t pos, const char *format, ...) {
  va_list args;
  FILE *f;

  if ((f = c2m_options->message_file) == NULL) return;
  n_warnings++;
  if (!c2m_options->ignore_warnings_p) {
    va_start (args, format);
    print_pos (f, pos, TRUE);
    fprintf (f, "warning -- ");
    vfprintf (f, format, args);
    va_end (args);
    fprintf (f, "\n");
  }
}